

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# a_doomweaps.cpp
# Opt level: O1

int AF_A_FirePistol(VMFrameStack *stack,VMValue *param,int numparam,VMReturn *ret,int numret)

{
  VM_UBYTE VVar1;
  AActor *ent;
  undefined8 *puVar2;
  AWeapon *this;
  player_t *player;
  int iVar3;
  undefined4 extraout_var;
  undefined8 uVar4;
  PClass *pPVar5;
  void *pvVar6;
  FState *state;
  PClass *pPVar7;
  PClassActor *pufftype;
  uint uVar8;
  byte bVar9;
  VMValue *pVVar10;
  char *__assertion;
  bool bVar11;
  FSoundID local_3c;
  FName local_38;
  FName local_34;
  
  pPVar7 = AActor::RegistrationInfo.MyClass;
  if (numparam < 1) {
    __assertion = "(paramnum) < numparam";
    goto LAB_00592af9;
  }
  if (((param->field_0).field_3.Type != '\x03') ||
     (((param->field_0).field_1.atag != 1 && ((param->field_0).field_1.a != (void *)0x0)))) {
LAB_00592ace:
    __assertion = 
    "param[paramnum].Type == REGT_POINTER && (param[paramnum].atag == ATAG_OBJECT || param[paramnum].a == NULL)"
    ;
LAB_00592af9:
    __assert_fail(__assertion,
                  "/workspace/llm4binary/github/license_c_cmakelists/alexey-lysiuk[P]gzdoom/src/g_doom/a_doomweaps.cpp"
                  ,0x48,"int AF_A_FirePistol(VMFrameStack *, VMValue *, int, VMReturn *, int)");
  }
  ent = (AActor *)(param->field_0).field_1.a;
  pVVar10 = param;
  uVar8 = numparam;
  if (ent != (AActor *)0x0) {
    if ((ent->super_DThinker).super_DObject.Class == (PClass *)0x0) {
      iVar3 = (**(ent->super_DThinker).super_DObject._vptr_DObject)(ent);
      (ent->super_DThinker).super_DObject.Class = (PClass *)CONCAT44(extraout_var,iVar3);
    }
    pPVar5 = (ent->super_DThinker).super_DObject.Class;
    bVar11 = pPVar5 == (PClass *)0x0;
    ret = (VMReturn *)(ulong)!bVar11;
    uVar8 = (uint)bVar11;
    pVVar10 = (VMValue *)(ulong)(pPVar5 == pPVar7 || bVar11);
    if (pPVar5 != pPVar7 && !bVar11) {
      do {
        pPVar5 = pPVar5->ParentClass;
        ret = (VMReturn *)(ulong)(pPVar5 != (PClass *)0x0);
        if (pPVar5 == pPVar7) break;
      } while (pPVar5 != (PClass *)0x0);
    }
    if ((char)ret == '\0') {
      __assertion = "self == NULL || self->IsKindOf(RUNTIME_CLASS(AActor))";
      goto LAB_00592af9;
    }
  }
  pPVar7 = AActor::RegistrationInfo.MyClass;
  if ((numparam != 1) && (VVar1 = param[1].field_0.field_3.Type, VVar1 != 0xff)) {
    if ((VVar1 != '\x03') ||
       ((param[1].field_0.field_1.atag != 1 && (param[1].field_0.field_1.a != (void *)0x0))))
    goto LAB_00592ace;
    puVar2 = (undefined8 *)param[1].field_0.field_1.a;
    if (puVar2 != (undefined8 *)0x0) {
      if (puVar2[1] == 0) {
        uVar4 = (**(code **)*puVar2)(puVar2,pVVar10,uVar8,ret);
        puVar2[1] = uVar4;
      }
      pPVar5 = (PClass *)puVar2[1];
      bVar11 = pPVar5 != (PClass *)0x0;
      if (pPVar5 != pPVar7 && bVar11) {
        do {
          pPVar5 = pPVar5->ParentClass;
          bVar11 = pPVar5 != (PClass *)0x0;
          if (pPVar5 == pPVar7) break;
        } while (pPVar5 != (PClass *)0x0);
      }
      if (!bVar11) {
        __assertion = "stateowner == NULL || stateowner->IsKindOf(RUNTIME_CLASS(AActor))";
        goto LAB_00592af9;
      }
    }
  }
  if ((numparam < 3) || (VVar1 = param[2].field_0.field_3.Type, VVar1 == 0xff)) {
    pvVar6 = (void *)0x0;
  }
  else {
    if ((VVar1 != '\x03') ||
       ((param[2].field_0.field_1.atag != 8 && (param[2].field_0.field_1.a != (void *)0x0)))) {
      __assertion = 
      "param[paramnum].Type == REGT_POINTER && (param[paramnum].atag == ATAG_STATEINFO || param[paramnum].a == NULL)"
      ;
      goto LAB_00592af9;
    }
    pvVar6 = param[2].field_0.field_1.a;
  }
  if (ent->player == (player_t *)0x0) {
    bVar9 = 1;
    goto LAB_00592a49;
  }
  this = ent->player->ReadyWeapon;
  if ((pvVar6 == (void *)0x0 || this == (AWeapon *)0x0) || (*(int *)((long)pvVar6 + 8) != 1)) {
LAB_00592a1c:
    APlayerPawn::PlayAttacking2(ent->player->mo);
    numparam = (int)(ent->player->refire == 0);
    bVar11 = true;
  }
  else {
    bVar11 = AWeapon::DepleteAmmo(this,this->bAltFire,true,1);
    if (bVar11) {
      player = ent->player;
      local_38.Index = 0xa3;
      state = AActor::FindState((AActor *)this,&local_38);
      P_SetPsprite(player,PSP_FLASH,state,true);
      goto LAB_00592a1c;
    }
    bVar11 = false;
  }
  bVar9 = (byte)numparam;
  if (!bVar11) {
    return 0;
  }
LAB_00592a49:
  local_3c.ID = S_FindSound("weapons/pistol");
  S_Sound(ent,1,&local_3c,1.0,1.0);
  local_34.Index = 0x40;
  pPVar7 = PClass::FindClass(&local_34);
  pufftype = dyn_cast<PClassActor>((DObject *)pPVar7);
  P_BulletSlope((AActor *)&stack0xffffffffffffffd0,(FTranslatedLineTarget *)ent,0);
  P_GunShot(ent,(bool)(bVar9 & 1),pufftype,(DAngle *)&stack0xffffffffffffffd0);
  return 0;
}

Assistant:

DEFINE_ACTION_FUNCTION(AActor, A_FirePistol)
{
	PARAM_ACTION_PROLOGUE;

	bool accurate;

	if (self->player != nullptr)
	{
		AWeapon *weapon = self->player->ReadyWeapon;
		if (weapon != nullptr && ACTION_CALL_FROM_PSPRITE())
		{
			if (!weapon->DepleteAmmo (weapon->bAltFire, true, 1))
				return 0;

			P_SetPsprite(self->player, PSP_FLASH, weapon->FindState(NAME_Flash), true);
		}
		self->player->mo->PlayAttacking2 ();

		accurate = !self->player->refire;
	}
	else
	{
		accurate = true;
	}

	S_Sound (self, CHAN_WEAPON, "weapons/pistol", 1, ATTN_NORM);

	P_GunShot (self, accurate, PClass::FindActor(NAME_BulletPuff), P_BulletSlope (self));
	return 0;
}